

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_CommandLogging.cpp
# Opt level: O0

bool __thiscall RenX_CommandLoggingPlugin::initialize(RenX_CommandLoggingPlugin *this)

{
  byte bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  RenX_CommandLoggingPlugin *this_local;
  
  bVar3 = sv("MinPlayerLevelToLog",0x13);
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,bVar3,1);
  this->min_access = iVar2;
  bVar3 = sv("MinCommandLevelToLog",0x14);
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,bVar3,1);
  this->min_cmd_access = iVar2;
  PrepFile(this);
  bVar1 = std::fstream::is_open();
  return (bool)(bVar1 & 1);
}

Assistant:

bool RenX_CommandLoggingPlugin::initialize() {
	RenX_CommandLoggingPlugin::min_access = this->config.get<int>("MinPlayerLevelToLog"sv, 1);
	RenX_CommandLoggingPlugin::min_cmd_access = this->config.get<int>("MinCommandLevelToLog"sv, 1);

	PrepFile();

	return fs.is_open();
}